

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3TableAffinity(Vdbe *v,Table *pTab,int iReg)

{
  sqlite3 *db;
  int addr;
  char *__s;
  long lVar1;
  size_t sVar2;
  long lVar3;
  uint p2;
  
  __s = pTab->zColAff;
  if (__s == (char *)0x0) {
    db = v->db;
    __s = (char *)sqlite3Malloc((long)pTab->nCol + 1);
    if (__s == (char *)0x0) {
      sqlite3OomFault(db);
      return;
    }
    if (pTab->nCol < 1) {
      lVar1 = 0;
    }
    else {
      lVar3 = 0x19;
      lVar1 = 0;
      do {
        __s[lVar1] = *(char *)((long)&pTab->aCol->zName + lVar3);
        lVar1 = lVar1 + 1;
        lVar3 = lVar3 + 0x20;
      } while (lVar1 < pTab->nCol);
    }
    do {
      __s[lVar1] = '\0';
      if (lVar1 < 1) break;
      lVar3 = lVar1 + -1;
      lVar1 = lVar1 + -1;
    } while (__s[lVar3] == 'A');
    pTab->zColAff = __s;
  }
  sVar2 = strlen(__s);
  p2 = (uint)sVar2 & 0x3fffffff;
  if ((sVar2 & 0x3fffffff) == 0) {
    return;
  }
  if (iReg == 0) {
    addr = -1;
  }
  else {
    addr = sqlite3VdbeAddOp3(v,0x5b,iReg,p2,0);
  }
  sqlite3VdbeChangeP4(v,addr,__s,p2);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3TableAffinity(Vdbe *v, Table *pTab, int iReg){
  int i;
  char *zColAff = pTab->zColAff;
  if( zColAff==0 ){
    sqlite3 *db = sqlite3VdbeDb(v);
    zColAff = (char *)sqlite3DbMallocRaw(0, pTab->nCol+1);
    if( !zColAff ){
      sqlite3OomFault(db);
      return;
    }

    for(i=0; i<pTab->nCol; i++){
      zColAff[i] = pTab->aCol[i].affinity;
    }
    do{
      zColAff[i--] = 0;
    }while( i>=0 && zColAff[i]==SQLITE_AFF_BLOB );
    pTab->zColAff = zColAff;
  }
  assert( zColAff!=0 );
  i = sqlite3Strlen30NN(zColAff);
  if( i ){
    if( iReg ){
      sqlite3VdbeAddOp4(v, OP_Affinity, iReg, i, 0, zColAff, i);
    }else{
      sqlite3VdbeChangeP4(v, -1, zColAff, i);
    }
  }
}